

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpinLock.hpp
# Opt level: O2

void __thiscall Threading::SpinLock::lock(SpinLock *this)

{
  __int_type_conflict _Var1;
  
  while( true ) {
    LOCK();
    _Var1 = (this->m_IsLocked)._M_base._M_i;
    (this->m_IsLocked)._M_base._M_i = true;
    UNLOCK();
    if ((_Var1 & 1U) == 0) break;
    Wait(this);
  }
  return;
}

Assistant:

void lock() noexcept
    {
        while (true)
        {
            // Assume that lock is free on the first try.
            const auto WasLocked = m_IsLocked.exchange(true, std::memory_order_acquire);
            if (!WasLocked)
                return; // The lock was not acquired when this thread performed the exchange

            Wait();
        }
    }